

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O2

void __thiscall SemanticTables::visit(SemanticTables *this,VarDeclNode *varDeclNode)

{
  VarDeclNode *pVVar1;
  IdListNode *pIVar2;
  TokenNode *pTVar3;
  char *lexeme;
  int iVar4;
  StructSymbol *pSVar5;
  TokenNode *pTVar6;
  int iVar7;
  IdListNode **ppIVar8;
  bool bVar9;
  
  pVVar1 = varDeclNode->next;
  if (pVVar1 != (VarDeclNode *)0x0) {
    (*(pVVar1->super_ASTNode)._vptr_ASTNode[3])(pVVar1,this);
  }
  pIVar2 = varDeclNode->idlist;
  if (pIVar2 != (IdListNode *)0x0) {
    (*(pIVar2->super_ASTNode)._vptr_ASTNode[3])(pIVar2,this);
  }
  ppIVar8 = &varDeclNode->idlist;
  do {
    pIVar2 = *ppIVar8;
    if (pIVar2 == (IdListNode *)0x0) {
      return;
    }
    pTVar6 = pIVar2->id;
    bVar9 = true;
    if ((pTVar6->super_ExpNode).pointer == false) {
      bVar9 = pIVar2->pointer != (PointerNode *)0x0;
    }
    pTVar3 = varDeclNode->type->id;
    iVar7 = pTVar3->token;
    (pTVar6->super_ExpNode).type = iVar7;
    lexeme = (pTVar3->super_ExpNode).lexeme;
    (pTVar6->super_ExpNode).typeLexeme = lexeme;
    (pTVar6->super_ExpNode).pointer = bVar9;
    (pTVar6->super_ExpNode).arraySize = (pTVar3->super_ExpNode).arraySize;
    if (iVar7 == 10) {
      pSVar5 = StructTable::cSearch(structTable,lexeme);
      if (pSVar5 == (StructSymbol *)0x0) {
        fprintf(_stderr,"[SEMANTIC ERROR - VarDeclNode] UNKNOWN VARIABLE TYPE line: %d type: %s \n",
                (ulong)(uint)(pIVar2->super_ASTNode).line,(pIVar2->id->super_ExpNode).typeLexeme);
        return;
      }
      pTVar6 = pIVar2->id;
    }
    iVar7 = 4;
    if ((bVar9 == false) && (iVar4 = (pTVar6->super_ExpNode).type, 1 < iVar4 - 0xbU)) {
      if (iVar4 == 10) {
        pSVar5 = StructTable::cSearch(structTable,(pTVar6->super_ExpNode).typeLexeme);
        iVar7 = pSVar5->size;
      }
      else {
        iVar7 = 1;
      }
    }
    if (pIVar2->array == (ArrayNode *)0x0) {
      iVar4 = -1;
    }
    else {
      iVar4 = atoi((pIVar2->array->super_ExpNode).lexeme);
      iVar7 = iVar7 * iVar4;
    }
    bVar9 = VarTable::cInsert(varTable,varDeclNode->type,(pIVar2->id->super_ExpNode).lexeme,bVar9,
                              iVar4,false,iVar7);
    if (!bVar9) {
      fprintf(_stderr,
              "[SEMANTIC ERROR - VarDeclNode] DUPLICATED VARIABLE NAME line: %d lexeme: %s \n",
              (ulong)(uint)(pIVar2->super_ASTNode).line,(pIVar2->id->super_ExpNode).lexeme);
    }
    ppIVar8 = &pIVar2->next;
  } while( true );
}

Assistant:

void SemanticTables::visit(VarDeclNode *varDeclNode) {

    if (varDeclNode->getNext() != NULL) {
        varDeclNode->getNext()->accept(this);
    }

    if (varDeclNode->getIdList() != NULL) {
        varDeclNode->getIdList()->accept(this);
    }

    IdListNode *idListAux = varDeclNode->getIdList();
    while (idListAux != NULL) {

        bool isPointer = idListAux->getId()->isPointer() || (idListAux->getPointer() != NULL);

        idListAux->getId()->setType(varDeclNode->getType()->getId()->getToken());
        idListAux->getId()->setTypeLexeme(varDeclNode->getType()->getId()->getLexeme());
        idListAux->getId()->setPointer(isPointer);
        idListAux->getId()->setArraySize(varDeclNode->getType()->getId()->getArraySize());
        if (varDeclNode->getType()->getType() == ID) {
            if (!structTable->cSearch(idListAux->getId()->getTypeLexeme())) {
                fprintf(stderr, "[SEMANTIC ERROR - VarDeclNode] UNKNOWN VARIABLE TYPE line: %d type: %s \n",
                        idListAux->getLine(), idListAux->getId()->getTypeLexeme());

                return;
            }

        }

        int size = 0;
        // Set var size
        if( idListAux->getId()->getType() == INT ||idListAux->getId()->getType() == FLOAT || isPointer)
            size = INT32_SIZE;
        else if (idListAux->getId()->getType() == ID) {
            StructSymbol* structSymbol = structTable->cSearch(idListAux->getId()->getTypeLexeme());
            size = structSymbol->getSize();
        } else {
            size = INT8_SIZE;
        }

        int arraySize = -1;

        if (idListAux->getArray()) {
            arraySize = atoi(idListAux->getArray()->getLexeme());
            size *= arraySize;
        }

        if (!varTable->cInsert(varDeclNode->getType(), idListAux->getId()->getLexeme(), isPointer,
                               arraySize, BOOL_FALSE, size)) {
            fprintf(stderr, "[SEMANTIC ERROR - VarDeclNode] DUPLICATED VARIABLE NAME line: %d lexeme: %s \n",
                    idListAux->getLine(), idListAux->getId()->getLexeme());

        }
        idListAux = idListAux->getNext();
    }

}